

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::Discreet3DSImporter::ParseChunk(Discreet3DSImporter *this,char *name,uint num)

{
  float fVar1;
  StreamReader<false,_false> *this_00;
  Scene *pSVar2;
  undefined8 uVar3;
  uint _limit;
  aiLight *this_01;
  aiCamera *paVar4;
  Logger *this_02;
  uint uVar5;
  float fVar6;
  ai_real aVar7;
  float fVar8;
  undefined8 uVar9;
  aiVector3t<float> aVar10;
  aiCamera *camera;
  Chunk chunk;
  aiLight *light;
  aiCamera *local_158;
  Chunk local_14e;
  char *local_148;
  char *local_140;
  undefined1 local_138 [32];
  aiVector3t<float> local_118;
  undefined1 local_108 [216];
  
  local_148 = name + num;
  local_140 = name;
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&local_14e);
    } while ((int)(local_14e.Size - 6) < 1);
    this_00 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_00,(local_14e.Size - 6) +
                                (*(int *)&this_00->current - *(int *)&this_00->buffer));
    if (local_14e.Flag == 0x4700) {
      paVar4 = (aiCamera *)operator_new(0x438);
      aiCamera::aiCamera(paVar4);
      local_158 = paVar4;
      std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::push_back
                (&this->mScene->mCameras,&local_158);
      paVar4 = local_158;
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,local_140,local_148);
      uVar9 = local_108._8_8_;
      if ((ulong)local_108._8_8_ < (pointer)0x400) {
        (paVar4->mName).length = (ai_uint32)local_108._8_8_;
        memcpy((paVar4->mName).data,(void *)local_108._0_8_,local_108._8_8_);
        (paVar4->mName).data[uVar9] = '\0';
      }
      std::__cxx11::string::~string((string *)local_108);
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      (local_158->mPosition).x = fVar6;
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      (local_158->mPosition).y = fVar6;
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      (local_158->mPosition).z = fVar6;
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      (local_158->mLookAt).x = fVar6 - (local_158->mPosition).x;
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      (local_158->mLookAt).y = fVar6 - (local_158->mPosition).y;
      fVar8 = StreamReader<false,_false>::Get<float>(this->stream);
      fVar8 = fVar8 - (local_158->mPosition).z;
      (local_158->mLookAt).z = fVar8;
      fVar6 = (local_158->mLookAt).x;
      fVar1 = (local_158->mLookAt).y;
      fVar6 = SQRT(fVar8 * fVar8 + fVar6 * fVar6 + fVar1 * fVar1);
      if (1e-05 <= fVar6) {
        aiVector3t<float>::operator/=(&local_158->mLookAt,fVar6);
      }
      else {
        this_02 = DefaultLogger::get();
        Logger::error(this_02,"3DS: Unable to read proper camera look-at vector");
        (local_158->mLookAt).x = 0.0;
        (local_158->mLookAt).y = 1.0;
        (local_158->mLookAt).z = 0.0;
      }
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      aVar10.x = (local_158->mLookAt).x;
      aVar10.y = (local_158->mLookAt).y;
      aVar10.z = (local_158->mLookAt).z;
      aiQuaterniont<float>::aiQuaterniont
                ((aiQuaterniont<float> *)local_138,aVar10,fVar6 * 0.017453292);
      aiQuaterniont<float>::GetMatrix
                ((aiMatrix3x3t<float> *)local_108,(aiQuaterniont<float> *)local_138);
      local_118.x = 0.0;
      local_118.y = 1.0;
      local_118.z = 0.0;
      aVar10 = ::operator*((aiMatrix3x3t<float> *)local_108,&local_118);
      (local_158->mUp).x = aVar10.x;
      (local_158->mUp).y = aVar10.y;
      (local_158->mUp).z = aVar10.z;
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      uVar5 = -(uint)(fVar6 * 0.017453292 < 0.001);
      local_158->mHorizontalFOV = (float)(uVar5 & 0x3f490fdb | ~uVar5 & (uint)(fVar6 * 0.017453292))
      ;
      if (this->bIsPrj == false) {
        ParseCameraChunk(this);
      }
    }
    else if (local_14e.Flag == 0x4600) {
      this_01 = (aiLight *)operator_new(0x46c);
      aiLight::aiLight(this_01);
      local_138._0_8_ = this_01;
      std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back
                (&this->mScene->mLights,(value_type *)local_138);
      uVar9 = local_138._0_8_;
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,local_140,local_148);
      uVar3 = local_108._8_8_;
      if ((ulong)local_108._8_8_ < (pointer)0x400) {
        *(int *)uVar9 = (int)local_108._8_8_;
        memcpy((char *)(uVar9 + 4),(void *)local_108._0_8_,local_108._8_8_);
        ((char *)(uVar9 + 4))[uVar3] = '\0';
      }
      std::__cxx11::string::~string((string *)local_108);
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      ((aiVector3D *)(local_138._0_8_ + 0x408))->x = fVar6;
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      *(float *)(local_138._0_8_ + 0x40c) = fVar6;
      fVar6 = StreamReader<false,_false>::Get<float>(this->stream);
      *(float *)(local_138._0_8_ + 0x410) = fVar6;
      uVar9 = 0x3f8000003f800000;
      ((aiColor3D *)(local_138._0_8_ + 0x438))->r = 1.0;
      ((aiColor3D *)(local_138._0_8_ + 0x438))->g = 1.0;
      *(ai_real *)(local_138._0_8_ + 0x440) = 1.0;
      aVar7 = 1.0;
      if (this->bIsPrj == false) {
        ParseLightChunk(this);
        uVar9._0_4_ = ((aiColor3D *)(local_138._0_8_ + 0x438))->r;
        uVar9._4_4_ = ((aiColor3D *)(local_138._0_8_ + 0x438))->g;
        aVar7 = *(ai_real *)(local_138._0_8_ + 0x440);
      }
      ((aiColor3D *)(local_138._0_8_ + 0x444))->r = (ai_real)(int)uVar9;
      ((aiColor3D *)(local_138._0_8_ + 0x444))->g = (ai_real)(int)((ulong)uVar9 >> 0x20);
      *(ai_real *)(local_138._0_8_ + 0x44c) = aVar7;
      ((aiColor3D *)(local_138._0_8_ + 0x450))->r = (this->mClrAmbient).r;
      *(ai_real *)(local_138._0_8_ + 0x454) = (this->mClrAmbient).g;
      *(ai_real *)(local_138._0_8_ + 0x458) = (this->mClrAmbient).b;
      if (*(aiLightSourceType *)(local_138._0_8_ + 0x404) == aiLightSource_UNDEFINED) {
        *(aiLightSourceType *)(local_138._0_8_ + 0x404) = aiLightSource_POINT;
      }
    }
    else if (local_14e.Flag == 0x4100) {
      pSVar2 = this->mScene;
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,local_140,local_148);
      D3DS::Mesh::Mesh((Mesh *)local_108,(string *)local_138);
      std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::
      emplace_back<Assimp::D3DS::Mesh>(&pSVar2->mMeshes,(Mesh *)local_108);
      D3DS::Mesh::~Mesh((Mesh *)local_108);
      std::__cxx11::string::~string((string *)local_138);
      ParseMeshChunk(this);
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
  } while (*(int *)&this->stream->limit != *(int *)&this->stream->current);
  return;
}

Assistant:

void Discreet3DSImporter::ParseChunk(const char* name, unsigned int num)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // IMPLEMENTATION NOTE;
    // Cameras or lights define their transformation in their parent node and in the
    // corresponding light or camera chunks. However, we read and process the latter
    // to to be able to return valid cameras/lights even if no scenegraph is given.

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_TRIMESH:
        {
        // this starts a new triangle mesh
        mScene->mMeshes.push_back(D3DS::Mesh(std::string(name, num)));

        // Read mesh chunks
        ParseMeshChunk();
        }
        break;

    case Discreet3DS::CHUNK_LIGHT:
        {
        // This starts a new light
        aiLight* light = new aiLight();
        mScene->mLights.push_back(light);

        light->mName.Set(std::string(name, num));

        // First read the position of the light
        light->mPosition.x = stream->GetF4();
        light->mPosition.y = stream->GetF4();
        light->mPosition.z = stream->GetF4();

        light->mColorDiffuse = aiColor3D(1.f,1.f,1.f);

        // Now check for further subchunks
        if (!bIsPrj) /* fixme */
            ParseLightChunk();

        // The specular light color is identical the the diffuse light color. The ambient light color
        // is equal to the ambient base color of the whole scene.
        light->mColorSpecular = light->mColorDiffuse;
        light->mColorAmbient  = mClrAmbient;

        if (light->mType == aiLightSource_UNDEFINED)
        {
            // It must be a point light
            light->mType = aiLightSource_POINT;
        }}
        break;

    case Discreet3DS::CHUNK_CAMERA:
        {
        // This starts a new camera
        aiCamera* camera = new aiCamera();
        mScene->mCameras.push_back(camera);
        camera->mName.Set(std::string(name, num));

        // First read the position of the camera
        camera->mPosition.x = stream->GetF4();
        camera->mPosition.y = stream->GetF4();
        camera->mPosition.z = stream->GetF4();

        // Then the camera target
        camera->mLookAt.x = stream->GetF4() - camera->mPosition.x;
        camera->mLookAt.y = stream->GetF4() - camera->mPosition.y;
        camera->mLookAt.z = stream->GetF4() - camera->mPosition.z;
        ai_real len = camera->mLookAt.Length();
        if (len < 1e-5) {

            // There are some files with lookat == position. Don't know why or whether it's ok or not.
            ASSIMP_LOG_ERROR("3DS: Unable to read proper camera look-at vector");
            camera->mLookAt = aiVector3D(0.0,1.0,0.0);

        }
        else camera->mLookAt /= len;

        // And finally - the camera rotation angle, in counter clockwise direction
        const ai_real angle =  AI_DEG_TO_RAD( stream->GetF4() );
        aiQuaternion quat(camera->mLookAt,angle);
        camera->mUp = quat.GetMatrix() * aiVector3D(0.0,1.0,0.0);

        // Read the lense angle
        camera->mHorizontalFOV = AI_DEG_TO_RAD ( stream->GetF4() );
        if (camera->mHorizontalFOV < 0.001f)  {
            camera->mHorizontalFOV = AI_DEG_TO_RAD(45.f);
        }

        // Now check for further subchunks
        if (!bIsPrj) /* fixme */ {
            ParseCameraChunk();
        }}
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}